

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O0

bool test_window2<16>(void)

{
  uint32_t start_00;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  int count;
  int start;
  keytype k;
  int j;
  int reps;
  int nbytes;
  Rand r;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  int start_01;
  int len;
  undefined4 in_stack_ffffffffffffffe0;
  int bytes;
  int iVar1;
  int len_00;
  Rand *in_stack_fffffffffffffff0;
  
  Rand::Rand((Rand *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  len_00 = 2;
  iVar1 = 10000;
  for (bytes = 0; bytes < iVar1; bytes = bytes + 1) {
    if (bytes % (iVar1 / 10) == 0) {
      printf(".");
    }
    Rand::rand_p(in_stack_fffffffffffffff0,(void *)CONCAT44(len_00,iVar1),bytes);
    for (len = 0; len < 0x10; len = len + 1) {
      for (start_01 = 0; start_01 < 0x20; start_01 = start_01 + 1) {
        in_stack_ffffffffffffffd4 =
             window1((void *)CONCAT44(bytes,in_stack_ffffffffffffffe0),len,start_01,
                     in_stack_ffffffffffffffd4);
        start_00 = window8(&stack0xffffffffffffffe2,len_00,len,start_01);
        in_stack_ffffffffffffffcc =
             window((void *)CONCAT44(len,start_01),in_stack_ffffffffffffffd4,start_00,
                    in_stack_ffffffffffffffcc);
        assert(in_stack_ffffffffffffffd4 == start_00);
        assert(in_stack_ffffffffffffffd4 == in_stack_ffffffffffffffcc);
      }
    }
  }
  printf("PASS %d\n",0x10);
  return true;
}

Assistant:

bool test_window2 ( void )
{
  Rand r(83874);

  struct keytype
  {
    uint8_t bytes[nbits/8];
  };

  int nbytes = nbits / 8;
  int reps = 10000;

  for(int j = 0; j < reps; j++)
  {
    if(j % (reps/10) == 0) printf(".");

    keytype k;

    r.rand_p(&k,nbytes);

    for(int start = 0; start < nbits; start++)
    {
      for(int count = 0; count < 32; count++)
      {
        uint32_t a = window1(&k,nbytes,start,count);
        uint32_t b = window8(&k,nbytes,start,count);
        uint32_t c = window(&k,nbytes,start,count);

        assert(a == b);
        assert(a == c);
      }
    }
  }

  printf("PASS %d\n",nbits);

  return true;
}